

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp_x86_avx512::forward_inplace
          (BinaryOp_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  Option *in_stack_00000078;
  int in_stack_00000080;
  float in_stack_00000084;
  Mat *in_stack_00000088;
  
  binary_op_scalar_inplace(in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  return 0;
}

Assistant:

int BinaryOp_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    binary_op_scalar_inplace(bottom_top_blob, b, op_type, opt);

    return 0;
}